

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

void rlib::operator<<(std::ostream&,rlib::JsonT<void>::Stringify_const&)::F::f(std::ostream&,rlib::
     JsonT<void>const&,rlib::JsonT<void>::Stringify::Format_const&,std::__cxx11::string_const__
               (ostream *os,JsonT<void> *j,Format *f,string *depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *__lhs;
  ostream *poVar2;
  long *plVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  long *plVar6;
  size_type *psVar7;
  char *pcVar8;
  JsonT<void> *j_00;
  _Self __tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ostream *local_c0;
  string *local_b8;
  JsonT<void> *local_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  _Rb_tree_node_base *local_88;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  _Rb_tree_node_base *local_58;
  string local_50;
  
  local_b8 = depth;
  local_b0 = j;
  switch(j->m_type) {
  case Null:
    std::__ostream_insert<char,std::char_traits<char>>(os,"null",4);
    return;
  case Bool:
    *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) =
         *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) | 1;
    std::ostream::_M_insert<bool>(SUB81(os,0));
    return;
  case Float:
    std::ostream::_M_insert<double>((j->field_1).m_float);
    return;
  case Int:
    std::ostream::_M_insert<long>((long)os);
    return;
  case String:
    escape(std::__cxx11::string_const__(&local_80,&(j->field_1).m_string);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x158dae);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_98 = *plVar6;
      lStack_90 = plVar3[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar6;
      local_a8 = (long *)*plVar3;
    }
    local_a0 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8);
    psVar7 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_e0.field_2._M_allocated_capacity = *psVar7;
      local_e0.field_2._8_8_ = plVar3[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar7;
      local_e0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_e0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_e0._M_dataplus._M_p,local_e0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return;
    }
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    return;
  case Array:
    std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
    local_c0 = os;
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(f->lf)._M_dataplus._M_p,(f->lf)._M_string_length);
    __lhs = local_b8;
    poVar5 = local_c0;
    j_00 = (JsonT<void> *)(local_b0->field_1).m_int;
    if (j_00 != (JsonT<void> *)(local_b0->field_1).m_string._M_string_length) {
      do {
        if (j_00 != (JsonT<void> *)(local_b0->field_1).m_int) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,(f->lf)._M_dataplus._M_p,(f->lf)._M_string_length);
        }
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(__lhs->_M_dataplus)._M_p,__lhs->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,(f->indent)._M_dataplus._M_p,(f->indent)._M_string_length);
        std::operator+(&local_e0,__lhs,&f->indent);
        string_const__(poVar5,j_00,f,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        j_00 = j_00 + 1;
      } while (j_00 != (JsonT<void> *)(local_b0->field_1).m_string._M_string_length);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_c0,(f->lf)._M_dataplus._M_p,(f->lf)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(local_b8->_M_dataplus)._M_p,local_b8->_M_string_length);
    pcVar8 = "]";
    break;
  case Map:
    std::__ostream_insert<char,std::char_traits<char>>(os,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(f->lf)._M_dataplus._M_p,(f->lf)._M_string_length);
    p_Var4 = *(_Rb_tree_node_base **)((long)&local_b0->field_1 + 0x18);
    local_58 = (_Rb_tree_node_base *)((long)&local_b0->field_1 + 8);
    if (p_Var4 != local_58) {
      local_60 = &f->indent;
      paVar1 = &local_e0.field_2;
      local_c0 = os;
      do {
        poVar5 = local_c0;
        if (p_Var4 != *(_Rb_tree_node_base **)((long)&local_b0->field_1 + 0x18)) {
          std::__ostream_insert<char,std::char_traits<char>>(local_c0,",",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,(f->lf)._M_dataplus._M_p,(f->lf)._M_string_length);
        }
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(local_b8->_M_dataplus)._M_p,local_b8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,(f->indent)._M_dataplus._M_p,(f->indent)._M_string_length);
        local_88 = p_Var4;
        escape(std::__cxx11::string_const__(&local_50,(string *)(p_Var4 + 1));
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x158dae);
        p_Var4 = local_88;
        psVar7 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_80.field_2._M_allocated_capacity = *psVar7;
          local_80.field_2._8_8_ = plVar3[3];
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        }
        else {
          local_80.field_2._M_allocated_capacity = *psVar7;
          local_80._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_80._M_string_length = plVar3[1];
        *plVar3 = (long)psVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_98 = *plVar6;
          lStack_90 = plVar3[3];
          local_a8 = &local_98;
        }
        else {
          local_98 = *plVar6;
          local_a8 = (long *)*plVar3;
        }
        local_a0 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_a8,(ulong)(f->colon)._M_dataplus._M_p);
        psVar7 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_e0.field_2._M_allocated_capacity = *psVar7;
          local_e0.field_2._8_8_ = plVar3[3];
          local_e0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar7;
          local_e0._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_e0._M_string_length = plVar3[1];
        *plVar3 = (long)psVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (local_a8 != &local_98) {
          operator_delete(local_a8,local_98 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_e0,local_b8,local_60);
        string_const__(local_c0,(JsonT<void> *)(p_Var4 + 2),f,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_88);
        os = local_c0;
      } while (p_Var4 != local_58);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(f->lf)._M_dataplus._M_p,(f->lf)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(local_b8->_M_dataplus)._M_p,local_b8->_M_string_length);
    pcVar8 = "}";
    break;
  default:
    goto switchD_0012dab1_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,1);
switchD_0012dab1_default:
  return;
}

Assistant:

static void f(std::ostream& os, const JsonT& j, const typename Stringify::Format& f, const std::string& depth) {
					switch (j.type()) {
					case Type::Null:
						os << "null";
						break;
					case Type::Bool:
						os << std::boolalpha << j.m_bool;
						break;
					case Type::Float:
						os << j.m_float;
						break;
					case Type::Int:
						os << j.m_int;
						break;
					case Type::String:
						os << "\"" + escape(j.m_string) + "\"";
						break;
					case Type::Array:
						os << "[" << f.lf;
						for (auto it = j.m_array.cbegin(); it != j.m_array.cend(); it++) {
							if (it != j.m_array.cbegin()) os << "," << f.lf;
							os << depth << f.indent;
							F::f(os, *it, f, depth + f.indent);
						}
						os << f.lf << depth << "]";
						break;
					case Type::Map:
						os << "{" << f.lf;
						for (auto it = j.m_map.cbegin(); it != j.m_map.cend(); it++) {
							if (it != j.m_map.cbegin()) os << "," << f.lf;
							os << depth << f.indent;
							os << "\"" + escape(it->first) + "\"" + f.colon;
							F::f(os, it->second, f, depth + f.indent);
						}
						os << f.lf << depth << "}";
						break;
					default:
						assert(false);
					}
				}